

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3GenerateRowIndexDelete(Parse *pParse,Table *pTab,int iCur,int *aRegIdx)

{
  int p2;
  Index *pIStack_38;
  int r1;
  Index *pIdx;
  int i;
  int *aRegIdx_local;
  int iCur_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  pIdx._4_4_ = 1;
  for (pIStack_38 = pTab->pIndex; pIStack_38 != (Index *)0x0; pIStack_38 = pIStack_38->pNext) {
    if ((aRegIdx == (int *)0x0) || (aRegIdx[pIdx._4_4_ + -1] != 0)) {
      p2 = sqlite3GenerateIndexKey(pParse,pIStack_38,iCur,0,0);
      sqlite3VdbeAddOp3(pParse->pVdbe,0x62,iCur + pIdx._4_4_,p2,pIStack_38->nColumn + 1);
    }
    pIdx._4_4_ = pIdx._4_4_ + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowIndexDelete(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iCur,          /* Cursor number for the table */
  int *aRegIdx       /* Only delete if aRegIdx!=0 && aRegIdx[i]>0 */
){
  int i;
  Index *pIdx;
  int r1;

  for(i=1, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
    if( aRegIdx!=0 && aRegIdx[i-1]==0 ) continue;
    r1 = sqlite3GenerateIndexKey(pParse, pIdx, iCur, 0, 0);
    sqlite3VdbeAddOp3(pParse->pVdbe, OP_IdxDelete, iCur+i, r1,pIdx->nColumn+1);
  }
}